

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.cc
# Opt level: O3

int ERR_pop_to_mark(void)

{
  err_error_st *peVar1;
  byte bVar2;
  uint uVar3;
  ERR_STATE *pEVar4;
  
  pEVar4 = err_get_state();
  if ((pEVar4 != (ERR_STATE *)0x0) && (uVar3 = pEVar4->top, pEVar4->bottom != uVar3)) {
    do {
      peVar1 = pEVar4->errors + uVar3;
      bVar2 = pEVar4->errors[uVar3].field_0x16;
      if ((bVar2 & 1) != 0) {
        peVar1->field_0x16 = bVar2 & 0xfe;
        return 1;
      }
      free(peVar1->data);
      peVar1->file = (char *)0x0;
      peVar1->data = (char *)0x0;
      peVar1->packed = 0;
      peVar1->line = 0;
      *(undefined2 *)&peVar1->field_0x16 = 0;
      uVar3 = pEVar4->top - 1;
      if (pEVar4->top == 0) {
        uVar3 = 0xf;
      }
      pEVar4->top = uVar3;
    } while (pEVar4->bottom != uVar3);
  }
  return 0;
}

Assistant:

int ERR_pop_to_mark(void) {
  ERR_STATE *const state = err_get_state();

  if (state == NULL) {
    return 0;
  }

  while (state->bottom != state->top) {
    struct err_error_st *error = &state->errors[state->top];

    if (error->mark) {
      error->mark = 0;
      return 1;
    }

    err_clear(error);
    if (state->top == 0) {
      state->top = ERR_NUM_ERRORS - 1;
    } else {
      state->top--;
    }
  }

  return 0;
}